

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O3

void __thiscall CArmInstruction::Encode(CArmInstruction *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uchar *puVar7;
  anon_struct_88_9_8dc853d5_for_Shift *paVar8;
  uint uVar9;
  uint uVar10;
  
  puVar6 = &(this->Opcode).encoding;
  if ((this->Vars).Opcode.UseNewEncoding != false) {
    puVar6 = &(this->Vars).Opcode.NewEncoding;
  }
  uVar3 = (this->Opcode).flags;
  iVar2._0_1_ = (this->Vars).Opcode.c;
  iVar2._1_1_ = (this->Vars).Opcode.a;
  iVar2._2_1_ = (this->Vars).Opcode.s;
  iVar2._3_1_ = (this->Vars).Opcode.x;
  uVar5 = (uint)uVar3;
  uVar4 = 0;
  if ((uVar5 >> 9 & 1) == 0) {
    uVar4 = iVar2 << 0x1c;
  }
  uVar9 = uVar4 | *puVar6 | 0x100000;
  if ((this->Vars).Opcode.s == false) {
    uVar9 = uVar4 | *puVar6;
  }
  bVar1 = (this->Vars).Shift.UseFinal;
  paVar8 = &(this->Vars).Shift;
  if (bVar1 != false) {
    paVar8 = (anon_struct_88_9_8dc853d5_for_Shift *)&(this->Vars).Shift.FinalType;
  }
  uVar4 = (byte)(this->Opcode).field_0x14 & 0xf;
  if ((this->Vars).Opcode.UseNewType != false) {
    uVar4 = (int)(this->Vars).Opcode.NewType;
  }
  if (0xf < uVar4) {
switchD_0016318a_caseD_5:
    printf("doh");
    goto LAB_0016360b;
  }
  iVar2 = (&(this->Vars).Shift.ShiftAmount)[(ulong)bVar1 * 2];
  switch(uVar4) {
  case 0:
    uVar9 = uVar9 | (this->Vars).rn.num;
    break;
  case 1:
    uVar4 = (this->Vars).Immediate;
    uVar5 = 0;
    if ((char)uVar3 < '\0') {
      uVar5 = (uVar4 & 2) << 0x17;
    }
    uVar5 = uVar4 >> 2 & 0xffffff | uVar5;
    goto LAB_00163599;
  case 2:
    uVar4 = (this->Vars).rn.num << 0x10;
    if ((uVar3 & 8) == 0) {
      uVar4 = 0;
    }
    uVar10 = (this->Vars).rd.num << 0xc;
    if ((uVar3 & 4) == 0) {
      uVar10 = 0;
    }
    uVar9 = uVar10 | uVar4 | uVar9;
    if ((uVar3 & 0x20) == 0) {
      if ((uVar5 >> 10 & 1) != 0) {
        if ((this->Vars).Shift.UseShift == true) {
          if ((this->Vars).Shift.ShiftByRegister == true) {
            uVar9 = uVar9 | (this->Vars).Shift.reg.num << 8 | 0x10;
          }
          else {
            uVar9 = uVar9 | iVar2 << 7;
          }
          uVar9 = uVar9 | (uint)paVar8->Type << 5;
        }
        uVar9 = uVar9 | (this->Vars).rm.num;
      }
    }
    else {
      uVar9 = iVar2 << 7 | (this->Vars).Immediate | uVar9;
    }
    break;
  case 3:
    uVar4 = uVar9 | 0x400000;
    if ((this->Vars).PsrData.spsr == false) {
      uVar4 = uVar9;
    }
    if ((uVar5 >> 0x14 & 1) == 0) {
      uVar9 = uVar4 | (this->Vars).PsrData.field << 0x10;
      if ((uVar5 >> 10 & 1) == 0) {
        if ((uVar3 & 0x20) != 0) {
          uVar9 = iVar2 << 7 | (this->Vars).Immediate | uVar9;
        }
      }
      else {
        uVar9 = uVar9 | (this->Vars).rm.num;
      }
    }
    else {
      uVar9 = uVar4 | (this->Vars).rd.num << 0xc;
    }
    break;
  case 4:
    uVar4 = 0;
    if ((uVar3 & 8) != 0) {
      uVar4 = (this->Vars).rn.num << 0xc;
    }
    uVar9 = (this->Vars).rs.num << 8 | (this->Vars).rd.num << 0x10 | uVar4 | uVar9;
    uVar4 = uVar9 | 0x40;
    if (((this->Vars).Opcode.y & 1U) == 0) {
      uVar4 = uVar9;
    }
    if ((uVar5 >> 0xe & 1) == 0) {
      uVar4 = uVar9;
    }
    uVar9 = uVar4 | 0x20;
    if (((this->Vars).Opcode.x & 1U) == 0) {
      uVar9 = uVar4;
    }
    if ((uVar5 >> 0xd & 1) == 0) {
      uVar9 = uVar4;
    }
LAB_00163239:
    uVar9 = uVar9 | (this->Vars).rm.num;
    break;
  default:
    goto switchD_0016318a_caseD_5;
  case 6:
    uVar4 = uVar9 | 0x200000;
    if ((this->Vars).writeback == false) {
      uVar4 = uVar9;
    }
    uVar9 = (this->Vars).rn.num << 0x10;
    if ((uVar3 & 8) == 0) {
      uVar9 = 0;
    }
    uVar10 = (this->Vars).rd.num << 0xc;
    if ((uVar3 & 4) == 0) {
      uVar10 = 0;
    }
    uVar4 = uVar10 | uVar9 | uVar4;
    uVar10 = uVar4 & 0xff7fffff;
    if (((this->Vars).SignPlus & 1U) != 0) {
      uVar10 = uVar4;
    }
    if ((uVar5 >> 0x1a & 1) == 0) {
      uVar10 = uVar4;
    }
    uVar9 = uVar4 & 0xff7fffff;
    if (((this->Vars).negative & 1U) == 0) {
      uVar9 = uVar10;
    }
    if ((uVar5 >> 0x11 & 1) == 0) {
      uVar9 = uVar10;
    }
    if ((uVar3 & 0x20) == 0) {
      if ((uVar5 >> 10 & 1) == 0) break;
      uVar4 = 0;
      if ((this->Vars).Shift.UseShift != false) {
        uVar4 = (uint)paVar8->Type << 5 | iVar2 << 7;
      }
      uVar4 = uVar4 | (this->Vars).rm.num;
      goto LAB_001632fb;
    }
    uVar4 = (this->Vars).Immediate;
    uVar5 = uVar9 & 0xff7fffff;
    if (-1 < (int)uVar4) {
      uVar5 = uVar9;
    }
    uVar9 = -uVar4;
    if (0 < (int)uVar4) {
      uVar9 = uVar4;
    }
    goto LAB_00163599;
  case 7:
    uVar4 = uVar9 | 0x200000;
    if ((this->Vars).writeback == false) {
      uVar4 = uVar9;
    }
    uVar4 = (this->Vars).rd.num << 0xc | (this->Vars).rn.num << 0x10 | uVar4;
    uVar10 = uVar4 & 0xff7fffff;
    if (((this->Vars).SignPlus & 1U) != 0) {
      uVar10 = uVar4;
    }
    if ((uVar5 >> 0x1a & 1) == 0) {
      uVar10 = uVar4;
    }
    uVar9 = uVar4 & 0xff7fffff;
    if (((this->Vars).negative & 1U) == 0) {
      uVar9 = uVar10;
    }
    if ((uVar5 >> 0x11 & 1) == 0) {
      uVar9 = uVar10;
    }
    if ((uVar3 & 0x20) == 0) {
      if ((uVar5 >> 10 & 1) == 0) break;
      goto LAB_00163239;
    }
    uVar4 = (this->Vars).Immediate;
    uVar5 = uVar9 & 0xff7fffff;
    if (-1 < (int)uVar4) {
      uVar5 = uVar9;
    }
    uVar9 = -uVar4;
    if (0 < (int)uVar4) {
      uVar9 = uVar4;
    }
    uVar9 = uVar9 & 0xf | (uVar9 & 0xf0) << 4;
LAB_00163599:
    uVar9 = uVar9 | uVar5;
    break;
  case 8:
    if ((uVar5 >> 0xb & 1) == 0) {
      if ((uVar5 >> 0xc & 1) != 0) {
        puVar7 = "\x03\x01\x02";
        goto LAB_001635a4;
      }
    }
    else {
      puVar7 = "\x03\x01\x02";
LAB_001635a4:
      uVar9 = uVar9 | (uint)puVar7[(this->Vars).Opcode.a] << 0x17;
    }
    uVar5 = uVar9 | 0x400000;
    if ((this->Vars).psr == false) {
      uVar5 = uVar9;
    }
    uVar4 = uVar5 | 0x200000;
    if ((this->Vars).writeback == false) {
      uVar4 = uVar5;
    }
    uVar9 = 0;
    if ((uVar3 & 8) != 0) {
      uVar9 = (this->Vars).rn.num << 0x10;
    }
    uVar9 = uVar9 | (this->Vars).rlist;
    goto LAB_001635eb;
  case 9:
  case 0xf:
    uVar9 = uVar9 | (this->Vars).rd.num << 0xc | (this->Vars).rm.num;
    if ((uVar3 & 8) == 0) break;
    uVar4 = (this->Vars).rn.num << 0x10;
    goto LAB_001632fb;
  case 10:
    uVar4 = (this->Vars).Immediate;
    if ((uVar5 >> 0x15 & 1) == 0) {
      uVar4 = (uVar4 & 0xfffffff0) << 4 | uVar4 & 0xf;
    }
LAB_001632fb:
    uVar9 = uVar9 | uVar4;
    break;
  case 0xb:
    uVar4 = (this->Vars).CopData.Cpop << 0x14;
    if ((uVar5 >> 0x16 & 1) == 0) {
      uVar4 = 0;
    }
    uVar10 = (this->Vars).CopData.Cpinf << 5;
    if ((uVar5 >> 0x17 & 1) == 0) {
      uVar10 = 0;
    }
    uVar9 = uVar9 | (this->Vars).CopData.cd.num << 0xc | (this->Vars).CopData.cn.num << 0x10 |
                    (this->Vars).CopData.pn.num << 8 | uVar4 | (this->Vars).CopData.cm.num | uVar10;
    break;
  case 0xd:
    uVar4 = (this->Vars).CopData.Cpop << 0x15;
    if ((uVar5 >> 0x16 & 1) == 0) {
      uVar4 = 0;
    }
    uVar10 = (this->Vars).CopData.Cpinf << 5;
    if ((uVar5 >> 0x17 & 1) == 0) {
      uVar10 = 0;
    }
    uVar9 = uVar9 | (this->Vars).rd.num << 0xc | (this->Vars).CopData.cn.num << 0x10 |
                    (this->Vars).CopData.pn.num << 8 | uVar4 | (this->Vars).CopData.cm.num | uVar10;
    break;
  case 0xe:
    uVar4 = (this->Vars).CopData.Cpop << 4 | (this->Vars).CopData.pn.num << 8 |
            (this->Vars).rd.num << 0xc | (this->Vars).rn.num << 0x10 | (this->Vars).CopData.cm.num;
LAB_001635eb:
    uVar9 = uVar9 | uVar4;
  }
LAB_0016360b:
  FileManager::writeU32(g_fileManager,uVar9);
  return;
}

Assistant:

void CArmInstruction::Encode() const
{
	unsigned int encoding = Vars.Opcode.UseNewEncoding ? Vars.Opcode.NewEncoding : Opcode.encoding;

	if ((Opcode.flags & ARM_UNCOND) == 0) encoding |= Vars.Opcode.c << 28;
	if (Vars.Opcode.s) encoding |= (1 << 20);

	unsigned char shiftType;
	int shiftAmount;
	if (Vars.Shift.UseFinal)
	{
		shiftType = Vars.Shift.FinalType;
		shiftAmount = Vars.Shift.FinalShiftAmount;
	} else {
		shiftType = Vars.Shift.Type;
		shiftAmount = Vars.Shift.ShiftAmount;
	}

	switch (Vars.Opcode.UseNewType ? Vars.Opcode.NewType : Opcode.type)
	{
	case ARM_TYPE3:		// ARM.3: Branch and Exchange (BX, BLX)
		encoding |= (Vars.rn.num << 0);
		break;
	case ARM_TYPE4:		// ARM.4: Branch and Branch with Link (B, BL, BLX)
		if ((Opcode.flags & ARM_HALFWORD) && (Vars.Immediate & 2)) encoding |= 1 << 24;
		encoding |= (Vars.Immediate >> 2) & 0xFFFFFF;
		break;
	case ARM_TYPE5:		// ARM.5: Data Processing
		if (Opcode.flags & ARM_N) encoding |= (Vars.rn.num << 16);
		if (Opcode.flags & ARM_D) encoding |= (Vars.rd.num << 12);

		if (Opcode.flags & ARM_IMMEDIATE)	// immediate als op2
		{
			encoding |= (shiftAmount << 7);
			encoding |= Vars.Immediate;
		} else if (Opcode.flags & ARM_REGISTER) {	// shifted register als op2
			if (Vars.Shift.UseShift)
			{
				if (Vars.Shift.ShiftByRegister)
				{
					encoding |= (Vars.Shift.reg.num << 8);
					encoding |= (1 << 4);
				} else {	// shiftbyimmediate
					encoding |= (shiftAmount << 7);
				}
				encoding |= (shiftType << 5);
			}
			encoding |= (Vars.rm.num << 0);
		}
		break;
	case ARM_TYPE6:		// ARM.6: PSR Transfer (MRS, MSR)
		if (Opcode.flags & ARM_MRS) //  MRS{cond} Rd,Psr          ;Rd = Psr
		{
			if (Vars.PsrData.spsr) encoding |= (1 << 22);
			encoding |= (Vars.rd.num << 12);
		} else {					//  MSR{cond} Psr{_field},Op  ;Psr[field] = Op
			if (Vars.PsrData.spsr) encoding |= (1 << 22);
			encoding |= (Vars.PsrData.field << 16);

			if (Opcode.flags & ARM_REGISTER)
			{
				encoding |= (Vars.rm.num << 0);
			} else if (Opcode.flags & ARM_IMMEDIATE)
			{
				encoding |= (shiftAmount << 7);
				encoding |= Vars.Immediate;
			}
		}
		break;
	case ARM_TYPE7:		// ARM.7: Multiply and Multiply-Accumulate (MUL,MLA)
		encoding |= (Vars.rd.num << 16);
		if (Opcode.flags & ARM_N) encoding |= (Vars.rn.num << 12);
		encoding |= (Vars.rs.num << 8);
		if ((Opcode.flags & ARM_Y) && Vars.Opcode.y) encoding |= (1 << 6);
		if ((Opcode.flags & ARM_X) && Vars.Opcode.x) encoding |= (1 << 5);
		encoding |= (Vars.rm.num << 0);
		break;
	case ARM_TYPE9:		// ARM.9: Single Data Transfer (LDR, STR, PLD)
		if (Vars.writeback) encoding |= (1 << 21);
		if (Opcode.flags & ARM_N) encoding |= (Vars.rn.num << 16);
		if (Opcode.flags & ARM_D) encoding |= (Vars.rd.num << 12);
		if ((Opcode.flags & ARM_SIGN) && !Vars.SignPlus) encoding &= ~(1 << 23);
		if ((Opcode.flags & ARM_ABS) && Vars.negative) encoding &= ~(1 << 23);
		if (Opcode.flags & ARM_IMMEDIATE)
		{
			int immediate = Vars.Immediate;
			if (immediate < 0)
			{
				encoding &= ~(1 << 23);
				immediate = abs(immediate);
			}
			encoding |= (immediate << 0);
		} else if (Opcode.flags & ARM_REGISTER)	// ... means the opcocde uses shifts with immediates
		{
			if (Vars.Shift.UseShift)
			{
				encoding |= (shiftAmount << 7);
				encoding |= (shiftType << 5);
			}
			encoding |= (Vars.rm.num << 0);
		}
		break;
	case ARM_TYPE10:	// ARM.10: Halfword, Doubleword, and Signed Data Transfer
		if (Vars.writeback) encoding |= (1 << 21);
		encoding |= (Vars.rn.num << 16);
		encoding |= (Vars.rd.num << 12);
		if ((Opcode.flags & ARM_SIGN) && !Vars.SignPlus) encoding &= ~(1 << 23);
		if ((Opcode.flags & ARM_ABS) && Vars.negative) encoding &= ~(1 << 23);
		if (Opcode.flags & ARM_IMMEDIATE)
		{
			int immediate = Vars.Immediate;
			if (immediate < 0)
			{
				encoding &= ~(1 << 23);
				immediate = abs(immediate);
			}
			encoding |= ((immediate & 0xF0) << 4);
			encoding |= (immediate & 0xF);
		} else if (Opcode.flags & ARM_REGISTER)
		{
			encoding |= (Vars.rm.num << 0);
		}
		break;
	case ARM_TYPE11:	// ARM.11: Block Data Transfer (LDM,STM)
		if (Opcode.flags & ARM_LOAD) encoding |= (LdmModes[Vars.Opcode.a] << 23);
		else if (Opcode.flags & ARM_STORE) encoding |= (StmModes[Vars.Opcode.a] << 23);
		if (Vars.psr) encoding |= (1 << 22);
		if (Vars.writeback) encoding |= (1 << 21);
		if (Opcode.flags & ARM_N) encoding |= (Vars.rn.num << 16);
		encoding |= (Vars.rlist);
		break;
	case ARM_TYPE12:	// ARM.12: Single Data Swap (SWP)
	case ARM_MISC:		// ARM.X: Count Leading Zeros
		encoding |= (Vars.rm.num << 0);
		encoding |= (Vars.rd.num << 12);
		if (Opcode.flags & ARM_N) encoding |= (Vars.rn.num << 16);
		break;
	case ARM_TYPE13:	// ARM.13: Software Interrupt (SWI,BKPT)
		if (Opcode.flags & ARM_SWI)
		{
			encoding |= Vars.Immediate;
		} else {
			encoding |= (Vars.Immediate & 0xF);
			encoding |= (Vars.Immediate >> 4) << 8;
		}
		break;
	case ARM_TYPE14:	// ARM.14: Coprocessor Data Operations (CDP)
		if (Opcode.flags & ARM_COPOP) encoding |= (Vars.CopData.Cpop << 20);
		encoding |= (Vars.CopData.cn.num << 16);
		encoding |= (Vars.CopData.cd.num << 12);
		encoding |= (Vars.CopData.pn.num << 8);
		if (Opcode.flags & ARM_COPINF) encoding |= (Vars.CopData.Cpinf << 5);
		encoding |= (Vars.CopData.cm.num << 0);
		break;
	case ARM_TYPE16:	// ARM.16: Coprocessor Register Transfers (MRC, MCR)
		if (Opcode.flags & ARM_COPOP) encoding |= (Vars.CopData.Cpop << 21);
		encoding |= (Vars.CopData.cn.num << 16);
		encoding |= (Vars.rd.num << 12);
		encoding |= (Vars.CopData.pn.num << 8);
		if (Opcode.flags & ARM_COPINF) encoding |= (Vars.CopData.Cpinf << 5);
		encoding |= (Vars.CopData.cm.num << 0);
		break;
	case ARM_TYPE17:	// ARM.X: Coprocessor Double-Register Transfer (MCRR,MRRC)
		encoding |= (Vars.rn.num << 16);
		encoding |= (Vars.rd.num << 12);
		encoding |= (Vars.CopData.pn.num << 8);
		encoding |= (Vars.CopData.Cpop << 4);
		encoding |= (Vars.CopData.cm.num << 0);
		break;
	default:
		printf("doh");
	}

	g_fileManager->writeU32((uint32_t)encoding);
}